

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void cpool_run_conn_shutdown(Curl_easy *data,connectdata *conn,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  undefined8 in_RAX;
  bool bVar3;
  bool bVar4;
  _Bool done2;
  _Bool done1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  cpool_run_conn_shutdown_handler(data,conn);
  if (((conn->bits).field_0x4 & 1) != 0) {
    *done = true;
    return;
  }
  if ((conn->connect_only == '\0') && (_Var1 = Curl_conn_is_connected(conn,0), _Var1)) {
    CVar2 = Curl_conn_shutdown(data,0,(_Bool *)((long)&uStack_28 + 7));
    bVar3 = CVar2 != CURLE_OK;
  }
  else {
    uStack_28 = CONCAT17(1,(undefined7)uStack_28);
    bVar3 = false;
  }
  if ((conn->connect_only == '\0') && (_Var1 = Curl_conn_is_connected(conn,1), _Var1)) {
    CVar2 = Curl_conn_shutdown(data,1,(_Bool *)((long)&uStack_28 + 6));
    bVar4 = CVar2 != CURLE_OK;
  }
  else {
    uStack_28 = CONCAT17(uStack_28._7_1_,0x1000000000000);
    bVar4 = false;
  }
  if ((bool)(bVar3 | bVar4)) {
    *done = true;
  }
  else {
    *done = (_Bool)(uStack_28._6_1_ & uStack_28._7_1_);
    if ((_Bool)(uStack_28._6_1_ & uStack_28._7_1_) == false) {
      return;
    }
  }
  conn->bits = (ConnectBits)((ulong)conn->bits | 0x100000000);
  return;
}

Assistant:

static void cpool_run_conn_shutdown(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    bool *done)
{
  CURLcode r1, r2;
  bool done1, done2;

  /* We expect to be attached when called */
  DEBUGASSERT(data->conn == conn);

  cpool_run_conn_shutdown_handler(data, conn);

  if(conn->bits.shutdown_filters) {
    *done = TRUE;
    return;
  }

  if(!conn->connect_only && Curl_conn_is_connected(conn, FIRSTSOCKET))
    r1 = Curl_conn_shutdown(data, FIRSTSOCKET, &done1);
  else {
    r1 = CURLE_OK;
    done1 = TRUE;
  }

  if(!conn->connect_only && Curl_conn_is_connected(conn, SECONDARYSOCKET))
    r2 = Curl_conn_shutdown(data, SECONDARYSOCKET, &done2);
  else {
    r2 = CURLE_OK;
    done2 = TRUE;
  }

  /* we are done when any failed or both report success */
  *done = (r1 || r2 || (done1 && done2));
  if(*done)
    conn->bits.shutdown_filters = TRUE;
}